

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  ImVector<ImGuiOldColumns> *this_00;
  ImGuiOldColumns *this_01;
  int i;
  int i_00;
  
  if (this->DrawList == &this->DrawListInst) {
    IM_DELETE<char>(this->Name);
    this_00 = &this->ColumnsStorage;
    for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
      this_01 = ImVector<ImGuiOldColumns>::operator[](this_00,i_00);
      ImGuiOldColumns::~ImGuiOldColumns(this_01);
    }
    ImDrawList::~ImDrawList(&this->DrawListInst);
    ImVector<ImGuiOldColumns>::~ImVector(this_00);
    ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->StateStorage).Data);
    ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
    ImVector<unsigned_int>::~ImVector(&this->IDStack);
    return;
  }
  __assert_fail("DrawList == &DrawListInst",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xb43,"ImGuiWindow::~ImGuiWindow()");
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiOldColumns();
}